

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressdialog.cpp
# Opt level: O2

void __thiscall QProgressDialog::forceShow(QProgressDialog *this)

{
  long lVar1;
  
  lVar1 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  QTimer::stop();
  if ((*(char *)(lVar1 + 0x349) == '\0') && (*(char *)(lVar1 + 0x34d) == '\0')) {
    QWidget::show((QWidget *)this);
    *(undefined1 *)(lVar1 + 0x349) = 1;
  }
  return;
}

Assistant:

void QProgressDialog::forceShow()
{
    Q_D(QProgressDialog);
    d->forceTimer->stop();
    if (d->shownOnce || d->cancellationFlag)
        return;

    show();
    d->shownOnce = true;
}